

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_copy(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  undefined4 uVar2;
  undefined2 uVar3;
  TRef TVar4;
  TRef TVar5;
  TRef TVar6;
  long in_RSI;
  long in_RDI;
  cTValue *unaff_retaddr;
  TRef in_stack_00000008;
  TRef in_stack_0000000c;
  CType *in_stack_00000010;
  TRef trlen;
  TRef trsrc;
  TRef trdst;
  CTState *cts;
  CType *in_stack_00000098;
  TRef in_stack_000000a4;
  TRef in_stack_000000a8;
  TRef in_stack_000000ac;
  jit_State *in_stack_000000b0;
  TValue *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7a;
  int iVar7;
  
  TVar6 = (TRef)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  uVar1 = *(uint *)(*(long *)(in_RDI + 0x80) + 4);
  iVar7 = *(int *)(*(long *)(in_RDI + 0x80) + 8);
  if (((**(int **)(in_RDI + 0x80) != 0) && (uVar1 != 0)) &&
     ((iVar7 != 0 || ((uVar1 & 0x1f000000) == 0x4000000)))) {
    TVar4 = crec_ct_tv(_trsrc,in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    TVar5 = crec_ct_tv(_trsrc,in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
    if (iVar7 == 0) {
      uVar2 = *(undefined4 *)(*(long *)(in_RDI + 0x80) + 4);
      *(undefined2 *)(in_RDI + 0x9c) = 0x4313;
      *(short *)(in_RDI + 0x98) = (short)uVar2;
      *(undefined2 *)(in_RDI + 0x9a) = 0;
      TVar6 = lj_opt_fold((jit_State *)
                          (ulong)CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78));
      uVar3 = (undefined2)TVar6;
      TVar4 = lj_ir_kint((jit_State *)CONCAT44(TVar4,TVar5),TVar6);
      *(undefined2 *)(in_RDI + 0x9c) = 0x2813;
      *(undefined2 *)(in_RDI + 0x98) = uVar3;
      *(short *)(in_RDI + 0x9a) = (short)TVar4;
      lj_opt_fold((jit_State *)CONCAT44(TVar6,CONCAT22(uVar3,in_stack_ffffffffffffff78)));
    }
    else {
      crec_toint((jit_State *)CONCAT44(TVar4,TVar5),
                 (CTState *)
                 CONCAT44(iVar7,CONCAT22(in_stack_ffffffffffffff7a,in_stack_ffffffffffffff78)),TVar6
                 ,in_stack_ffffffffffffff68);
    }
    *(undefined8 *)(in_RSI + 8) = 0;
    crec_copy(in_stack_000000b0,in_stack_000000ac,in_stack_000000a8,in_stack_000000a4,
              in_stack_00000098);
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_copy(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trsrc = J->base[1], trlen = J->base[2];
  if (trdst && trsrc && (trlen || tref_isstr(trsrc))) {
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trsrc = crec_ct_tv(J, ctype_get(cts, CTID_P_CVOID), 0, trsrc, &rd->argv[1]);
    if (trlen) {
      trlen = crec_toint(J, cts, trlen, &rd->argv[2]);
    } else {
      trlen = emitir(IRTI(IR_FLOAD), J->base[1], IRFL_STR_LEN);
      trlen = emitir(IRTI(IR_ADD), trlen, lj_ir_kint(J, 1));
    }
    rd->nres = 0;
    crec_copy(J, trdst, trsrc, trlen, NULL);
  }  /* else: interpreter will throw. */
}